

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void thinning(Mat *im)

{
  Mat *pMVar1;
  int iVar2;
  double local_2d0;
  _InputArray local_2c8;
  _OutputArray local_2b0;
  _OutputArray local_298;
  _InputArray local_280;
  _InputArray local_268;
  Mat local_250 [8];
  Mat diff;
  MatSize local_1e0 [8];
  MatExpr local_1d8 [352];
  MatExpr local_78 [8];
  Mat prev;
  double local_18;
  Mat *local_10;
  Mat *im_local;
  
  local_18 = 255.0;
  local_10 = im;
  cv::operator/=(im,&local_18);
  cv::MatSize::operator()(local_1e0);
  cv::Mat::zeros(local_1d8,local_1e0,0);
  cv::MatExpr::operator_cast_to_Mat(local_78);
  cv::MatExpr::~MatExpr(local_1d8);
  cv::Mat::Mat(local_250);
  do {
    thinningIteration(local_10,0);
    thinningIteration(local_10,1);
    cv::_InputArray::_InputArray(&local_268,local_10);
    cv::_InputArray::_InputArray(&local_280,(Mat *)local_78);
    cv::_OutputArray::_OutputArray(&local_298,local_250);
    cv::absdiff(&local_268,&local_280,&local_298);
    cv::_OutputArray::~_OutputArray(&local_298);
    cv::_InputArray::~_InputArray(&local_280);
    cv::_InputArray::~_InputArray(&local_268);
    pMVar1 = local_10;
    cv::_OutputArray::_OutputArray(&local_2b0,(Mat *)local_78);
    cv::Mat::copyTo((_OutputArray *)pMVar1);
    cv::_OutputArray::~_OutputArray(&local_2b0);
    cv::_InputArray::_InputArray(&local_2c8,local_250);
    iVar2 = cv::countNonZero(&local_2c8);
    cv::_InputArray::~_InputArray(&local_2c8);
  } while (0 < iVar2);
  local_2d0 = 255.0;
  cv::operator*=(local_10,&local_2d0);
  cv::Mat::~Mat(local_250);
  cv::Mat::~Mat((Mat *)local_78);
  return;
}

Assistant:

void thinning(cv::Mat& im)
{
    im /= 255;
 
    cv::Mat prev = cv::Mat::zeros(im.size(), CV_8UC1);
    cv::Mat diff;
 
    do {
        thinningIteration(im, 0);
        thinningIteration(im, 1);
        cv::absdiff(im, prev, diff);
        im.copyTo(prev);
    } 
    while (cv::countNonZero(diff) > 0);
 
    im *= 255;
}